

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O1

IMAGE_IMPORT_BY_NAME * __thiscall ImportedFuncWrapper::getImportByNamePtr(ImportedFuncWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IMAGE_IMPORT_BY_NAME *pIVar4;
  bool isOk;
  char local_9;
  long lVar3;
  undefined4 extraout_var_01;
  
  local_9 = '\0';
  iVar2 = (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,0,0xffffffffffffffff);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if ((lVar3 == -1) || (local_9 == '\0')) {
    iVar2 = (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                      (this,1,0xffffffffffffffff,&local_9);
    lVar3 = CONCAT44(extraout_var_00,iVar2);
  }
  if (local_9 == '\x01') {
    pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,lVar3,2,4,0);
    pIVar4 = (IMAGE_IMPORT_BY_NAME *)CONCAT44(extraout_var_01,iVar2);
  }
  else {
    pIVar4 = (IMAGE_IMPORT_BY_NAME *)0x0;
  }
  return pIVar4;
}

Assistant:

IMAGE_IMPORT_BY_NAME* ImportedFuncWrapper::getImportByNamePtr()
{
    bool isOk = false;
    uint64_t offset = this->getNumValue(ImportedFuncWrapper::ORIG_THUNK, &isOk);
    if (!isOk || offset == INVALID_ADDR) {
        offset = this->getNumValue(ImportedFuncWrapper::THUNK, &isOk);
    }
    if (!isOk) return NULL;
    BYTE *ptr = this->m_Exe->getContentAt(offset, Executable::RVA, sizeof(IMAGE_IMPORT_BY_NAME));
    return (IMAGE_IMPORT_BY_NAME*) ptr;
}